

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

LY_ERR ly_time_str2ts(char *value,timespec *ts)

{
  LY_ERR LVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  LY_ERR ret__;
  char *pcVar5;
  char *fractions_s;
  char frac_buf [10];
  char *local_38;
  char local_30 [16];
  
  if (value == (char *)0x0) {
    pcVar5 = "value";
  }
  else {
    if (ts != (timespec *)0x0) {
      LVar1 = ly_time_str2time(value,&ts->tv_sec,&local_38);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if (local_38 == (char *)0x0) {
        ts->tv_nsec = 0;
      }
      else {
        builtin_strncpy(local_30,"000000000",10);
        sVar2 = strlen(local_38);
        iVar4 = 9;
        if ((int)sVar2 < 9) {
          iVar4 = (int)sVar2;
        }
        memcpy(local_30,local_38,(long)iVar4);
        lVar3 = atol(local_30);
        ts->tv_nsec = lVar3;
        free(local_38);
      }
      return LY_SUCCESS;
    }
    pcVar5 = "ts";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"ly_time_str2ts");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_time_str2ts(const char *value, struct timespec *ts)
{
    LY_ERR rc;
    char *fractions_s, frac_buf[10];
    int frac_len;

    LY_CHECK_ARG_RET(NULL, value, ts, LY_EINVAL);

    rc = ly_time_str2time(value, &ts->tv_sec, &fractions_s);
    LY_CHECK_RET(rc);

    /* convert fractions of a second to nanoseconds */
    if (fractions_s) {
        /* init frac_buf with zeroes */
        memset(frac_buf, '0', 9);
        frac_buf[9] = '\0';

        frac_len = strlen(fractions_s);
        memcpy(frac_buf, fractions_s, frac_len > 9 ? 9 : frac_len);
        ts->tv_nsec = atol(frac_buf);
        free(fractions_s);
    } else {
        ts->tv_nsec = 0;
    }

    return LY_SUCCESS;
}